

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

short * __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,size_t output_frame_count,
          size_t *input_frames_used)

{
  size_t *psVar1;
  uint uVar2;
  short *psVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t in_len;
  uint32_t out_len;
  uint local_30;
  uint local_2c;
  
  uVar5 = (this->super_processor).channels * output_frame_count;
  if ((this->resampling_out_buffer).capacity_ < uVar5) {
    auto_array<short>::reserve(&this->resampling_out_buffer,uVar5);
  }
  local_30 = (uint)((this->resampling_in_buffer).length_ / (ulong)(this->super_processor).channels);
  local_2c = (uint)output_frame_count;
  speex_resampler_process_interleaved_int
            (this->speex_resampler,(this->resampling_in_buffer).data_,&local_30,
             (this->resampling_out_buffer).data_,&local_2c);
  if (local_2c < output_frame_count) {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (1 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: underrun during resampling: got %u frames, expected %zu\n",
                 "cubeb_resampler_internal.h",0x105,(ulong)local_2c,output_frame_count);
    }
    uVar2 = (this->super_processor).channels;
    uVar4 = local_2c * uVar2;
    uVar5 = (ulong)uVar4;
    uVar6 = output_frame_count * uVar2;
    if (uVar5 <= uVar6 && uVar6 - uVar5 != 0) {
      psVar3 = (this->resampling_out_buffer).data_;
      do {
        uVar4 = uVar4 + 1;
        psVar3[uVar5] = 0;
        uVar5 = (ulong)uVar4;
      } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
    }
  }
  uVar6 = (ulong)(this->super_processor).channels * (ulong)local_30;
  uVar5 = (this->resampling_in_buffer).length_;
  if (uVar6 <= uVar5) {
    psVar3 = (this->resampling_in_buffer).data_;
    memmove(psVar3,psVar3 + uVar6,(uVar5 - uVar6) * 2);
    psVar1 = &(this->resampling_in_buffer).length_;
    *psVar1 = *psVar1 - uVar6;
  }
  *input_frames_used = (ulong)local_30;
  return (this->resampling_out_buffer).data_;
}

Assistant:

T * output(size_t output_frame_count, size_t * input_frames_used)
  {
    if (resampling_out_buffer.capacity() < frames_to_samples(output_frame_count)) {
      resampling_out_buffer.reserve(frames_to_samples(output_frame_count));
    }

    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len,
                   resampling_out_buffer.data(), &out_len);

    if (out_len < output_frame_count) {
      LOGV("underrun during resampling: got %u frames, expected %zu", (unsigned)out_len, output_frame_count);
      // silence the rightmost part
      T* data = resampling_out_buffer.data();
      for (uint32_t i = frames_to_samples(out_len); i < frames_to_samples(output_frame_count); i++) {
        data[i] = 0;
      }
    }

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));
    *input_frames_used = in_len;

    return resampling_out_buffer.data();
  }